

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O0

void slang::function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
     callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__2>
               (intptr_t callable,DiagCode params,unsigned_long params_1,unsigned_long params_2,
               optional<char> params_3)

{
  slang::ast::checkFormatString::anon_class_16_2_c565372f::operator()
            ((anon_class_16_2_c565372f *)callable,params,params_1,params_2,params_3);
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }